

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

vector<poly,_std::allocator<poly>_> * __thiscall
matrix::rref_nullspace
          (vector<poly,_std::allocator<poly>_> *__return_storage_ptr__,matrix *this,
          vector<int,_std::allocator<int>_> *piv)

{
  pointer ppVar1;
  int iVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_type __n;
  ulong __n_00;
  int i;
  poly p;
  poly local_70;
  
  (__return_storage_ptr__->
  super__Safe_container<std::__debug::vector<poly,_std::allocator<poly>_>,_std::allocator<poly>,___gnu_debug::_Safe_sequence,_true>
  ).super__Safe_sequence<std::__debug::vector<poly,_std::allocator<poly>_>_>.
  super__Safe_sequence_base._M_iterators = (_Safe_iterator_base *)0x0;
  (__return_storage_ptr__->
  super__Safe_container<std::__debug::vector<poly,_std::allocator<poly>_>,_std::allocator<poly>,___gnu_debug::_Safe_sequence,_true>
  ).super__Safe_sequence<std::__debug::vector<poly,_std::allocator<poly>_>_>.
  super__Safe_sequence_base._M_const_iterators = (_Safe_iterator_base *)0x0;
  (__return_storage_ptr__->
  super__Safe_container<std::__debug::vector<poly,_std::allocator<poly>_>,_std::allocator<poly>,___gnu_debug::_Safe_sequence,_true>
  ).super__Safe_sequence<std::__debug::vector<poly,_std::allocator<poly>_>_>.
  super__Safe_sequence_base._M_version = 1;
  (__return_storage_ptr__->super_vector<poly,_std::allocator<poly>_>).
  super__Vector_base<poly,_std::allocator<poly>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (__return_storage_ptr__->super_vector<poly,_std::allocator<poly>_>).
  super__Vector_base<poly,_std::allocator<poly>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super_vector<poly,_std::allocator<poly>_>).
  super__Vector_base<poly,_std::allocator<poly>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  (__return_storage_ptr__->
  super__Safe_vector<std::__debug::vector<poly,_std::allocator<poly>_>,_std::__cxx1998::vector<poly,_std::allocator<poly>_>_>
  )._M_guaranteed_capacity = 0;
  ppVar1 = (__return_storage_ptr__->super_vector<poly,_std::allocator<poly>_>).
           super__Vector_base<poly,_std::allocator<poly>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  if (ppVar1 != (pointer)0x0) {
    (__return_storage_ptr__->
    super__Safe_vector<std::__debug::vector<poly,_std::allocator<poly>_>,_std::__cxx1998::vector<poly,_std::allocator<poly>_>_>
    )._M_guaranteed_capacity = (long)ppVar1 >> 6;
  }
  if (0 < this->ncols) {
    i = 0;
    __n_00 = 0;
    do {
      if (__n_00 < (ulong)((long)(piv->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(piv->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 2)) {
        pvVar3 = std::__debug::vector<int,_std::allocator<int>_>::operator[](piv,__n_00);
        if (i != *pvVar3) goto LAB_0010fa54;
        __n_00 = __n_00 + 1;
      }
      else {
LAB_0010fa54:
        pvVar4 = std::__debug::vector<poly,_std::allocator<poly>_>::operator[](&this->rows,0);
        poly::poly(&local_70,
                   (long)(int)((*(int *)&(pvVar4->x).
                                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                *(int *)&(pvVar4->x).
                                         super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start & 0x1ffffffcU) <<
                              3));
        poly::xor_bit(&local_70,i,1);
        if ((piv->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
            != (piv->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start) {
          __n = 0;
          do {
            pvVar4 = std::__debug::vector<poly,_std::allocator<poly>_>::operator[](&this->rows,__n);
            iVar2 = poly::operator[](pvVar4,i);
            if (iVar2 != 0) {
              pvVar3 = std::__debug::vector<int,_std::allocator<int>_>::operator[](piv,__n);
              poly::xor_bit(&local_70,*pvVar3,1);
            }
            __n = __n + 1;
          } while (__n < (ulong)((long)(piv->super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(piv->super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 2));
        }
        std::__debug::vector<poly,_std::allocator<poly>_>::push_back
                  (__return_storage_ptr__,&local_70);
        std::__debug::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_70.x);
      }
      i = i + 1;
    } while (i < this->ncols);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<poly> matrix::rref_nullspace(const std::vector<int> &piv) const {
    std::vector<poly> ret;
    size_t k = 0;
    for (int j = 0; j < ncols; j++) {
        if (k < piv.size() && j == piv[k]) {
            k++;
            continue;
        }
        poly p(rows[0].bits());
        p.xor_bit(j, 1);
        for (size_t i = 0; i < piv.size(); i++)
            if (rows[i][j])
                p.xor_bit(piv[i], 1);
        ret.push_back(p);
    }
    return ret;
}